

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_pack.cpp
# Opt level: O2

bool __thiscall libtorrent::settings_pack::has_val(settings_pack *this,int name)

{
  __normal_iterator<const_std::pair<unsigned_short,_int>_*,_std::vector<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>_>
  __last;
  __normal_iterator<const_std::pair<unsigned_short,_bool>_*,_std::vector<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>_>
  __first;
  __normal_iterator<const_std::pair<unsigned_short,_bool>_*,_std::vector<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>_>
  __last_00;
  __normal_iterator<const_std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  _Var1;
  __normal_iterator<const_std::pair<unsigned_short,_int>_*,_std::vector<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>_>
  _Var2;
  bool bVar3;
  pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v;
  undefined1 local_68 [4];
  int local_64;
  _Alloc_hider local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30 [16];
  
  local_68._0_2_ = (undefined2)name;
  switch((uint)name >> 0xe & 3) {
  case 0:
    if ((long)(this->m_strings).
              super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->m_strings).
              super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x208) {
      return true;
    }
    local_40 = local_30;
    local_60._M_p = (pointer)&local_50;
    local_50._M_local_buf[0] = '\0';
    local_58 = 0;
    local_38 = 0;
    local_30[0] = 0;
    ::std::__cxx11::string::~string((string *)&local_40);
    _Var1 = ::std::
            __lower_bound<__gnu_cxx::__normal_iterator<std::pair<unsigned_short,std::__cxx11::string>const*,std::vector<std::pair<unsigned_short,std::__cxx11::string>,std::allocator<std::pair<unsigned_short,std::__cxx11::string>>>>,std::pair<unsigned_short,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_val<bool(*)(std::pair<unsigned_short,std::__cxx11::string>const&,std::pair<unsigned_short,std::__cxx11::string>const&)>>
                      ((this->m_strings).
                       super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (this->m_strings).
                       super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       (pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_68,
                       (_Iter_comp_val<bool_(*)(const_std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>
                        )0x2bf1b1);
    if (_Var1._M_current ==
        (this->m_strings).
        super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      bVar3 = false;
    }
    else {
      bVar3 = (uint)(_Var1._M_current)->first == name;
    }
    ::std::__cxx11::string::~string((string *)&local_60);
    return bVar3;
  case 1:
    _Var2._M_current =
         (this->m_ints).
         super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    __last._M_current =
         (this->m_ints).
         super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if ((long)__last._M_current - (long)_Var2._M_current == 0x4f8) {
      return true;
    }
    local_64 = 0;
    _Var2 = ::std::
            __lower_bound<__gnu_cxx::__normal_iterator<std::pair<unsigned_short,int>const*,std::vector<std::pair<unsigned_short,int>,std::allocator<std::pair<unsigned_short,int>>>>,std::pair<unsigned_short,int>,__gnu_cxx::__ops::_Iter_comp_val<bool(*)(std::pair<unsigned_short,int>const&,std::pair<unsigned_short,int>const&)>>
                      (_Var2,__last,(pair<unsigned_short,_int> *)local_68,
                       (_Iter_comp_val<bool_(*)(const_std::pair<unsigned_short,_int>_&,_const_std::pair<unsigned_short,_int>_&)>
                        )0x2bf1bb);
    if (_Var2._M_current !=
        (this->m_ints).
        super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
LAB_002bf143:
      return (uint)(_Var2._M_current)->first == name;
    }
    break;
  case 2:
    __first._M_current =
         (this->m_bools).
         super__Vector_base<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    __last_00._M_current =
         (this->m_bools).
         super__Vector_base<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if ((long)__last_00._M_current - (long)__first._M_current == 0x150) {
      return true;
    }
    local_68[2] = false;
    _Var2._M_current =
         (pair<unsigned_short,_int> *)
         ::std::
         __lower_bound<__gnu_cxx::__normal_iterator<std::pair<unsigned_short,bool>const*,std::vector<std::pair<unsigned_short,bool>,std::allocator<std::pair<unsigned_short,bool>>>>,std::pair<unsigned_short,bool>,__gnu_cxx::__ops::_Iter_comp_val<bool(*)(std::pair<unsigned_short,bool>const&,std::pair<unsigned_short,bool>const&)>>
                   (__first,__last_00,(pair<unsigned_short,_bool> *)local_68,
                    (_Iter_comp_val<bool_(*)(const_std::pair<unsigned_short,_bool>_&,_const_std::pair<unsigned_short,_bool>_&)>
                     )0x2bf1c5);
    if (_Var2._M_current !=
        (pair<unsigned_short,_int> *)
        (this->m_bools).
        super__Vector_base<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) goto LAB_002bf143;
  }
  return false;
}

Assistant:

bool settings_pack::has_val(int const name) const
	{
		switch (name & type_mask)
		{
			case string_type_base:
			{
				// this is an optimization. If the settings pack is complete,
				// i.e. has every key, we don't need to search, it's just a lookup
				if (m_strings.size() == settings_pack::num_string_settings)
					return true;
				std::pair<std::uint16_t, std::string> v(aux::numeric_cast<std::uint16_t>(name), std::string());
				auto i = std::lower_bound(m_strings.begin(), m_strings.end(), v
						, &compare_first<std::string>);
				return i != m_strings.end() && i->first == name;
			}
			case int_type_base:
			{
				// this is an optimization. If the settings pack is complete,
				// i.e. has every key, we don't need to search, it's just a lookup
				if (m_ints.size() == settings_pack::num_int_settings)
					return true;
				std::pair<std::uint16_t, int> v(aux::numeric_cast<std::uint16_t>(name), 0);
				auto i = std::lower_bound(m_ints.begin(), m_ints.end(), v
						, &compare_first<int>);
				return i != m_ints.end() && i->first == name;
			}
			case bool_type_base:
			{
				// this is an optimization. If the settings pack is complete,
				// i.e. has every key, we don't need to search, it's just a lookup
				if (m_bools.size() == settings_pack::num_bool_settings)
					return true;
				std::pair<std::uint16_t, bool> v(aux::numeric_cast<std::uint16_t>(name), false);
				auto i = std::lower_bound(m_bools.begin(), m_bools.end(), v
						, &compare_first<bool>);
				return i != m_bools.end() && i->first == name;
			}
		}
		TORRENT_ASSERT_FAIL();
		return false;
	}